

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

string * __thiscall
foxxll::disk_config::fileio_string_abi_cxx11_(string *__return_storage_ptr__,disk_config *this)

{
  runtime_error *this_00;
  ostream *poVar1;
  string local_338 [32];
  ostringstream local_318 [8];
  ostringstream msg;
  ostringstream local_190 [8];
  ostringstream oss;
  disk_config *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,(string *)&this->io_impl);
  if ((this->autogrow & 1U) == 0) {
    std::operator<<((ostream *)local_190," autogrow=no");
  }
  if ((this->delete_on_exit & 1U) != 0) {
    std::operator<<((ostream *)local_190," delete_on_exit");
  }
  if (this->direct == DIRECT_OFF) {
    std::operator<<((ostream *)local_190," direct=off");
  }
  else if (this->direct != DIRECT_TRY) {
    if (this->direct != DIRECT_ON) {
      std::__cxx11::ostringstream::ostringstream(local_318);
      poVar1 = std::operator<<((ostream *)local_318,"Error in ");
      poVar1 = std::operator<<(poVar1,"std::string foxxll::disk_config::fileio_string() const");
      poVar1 = std::operator<<(poVar1," : ");
      std::operator<<(poVar1,"Invalid setting for \'direct\' option.");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this_00,local_338);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator<<((ostream *)local_190," direct=on");
  }
  if ((this->flash & 1U) != 0) {
    std::operator<<((ostream *)local_190," flash");
  }
  if ((this->queue != -1) && (this->queue != -2)) {
    poVar1 = std::operator<<((ostream *)local_190," queue=");
    std::ostream::operator<<(poVar1,this->queue);
  }
  if (this->device_id != 0xffffffff) {
    poVar1 = std::operator<<((ostream *)local_190," devid=");
    std::ostream::operator<<(poVar1,this->device_id);
  }
  if ((this->raw_device & 1U) != 0) {
    std::operator<<((ostream *)local_190," raw_device");
  }
  if ((this->unlink_on_open & 1U) != 0) {
    std::operator<<((ostream *)local_190," unlink_on_open");
  }
  if (this->queue_length != 0) {
    poVar1 = std::operator<<((ostream *)local_190," queue_length=");
    std::ostream::operator<<(poVar1,this->queue_length);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string disk_config::fileio_string() const
{
    std::ostringstream oss;

    oss << io_impl;

    if (!autogrow)
        oss << " autogrow=no";

    if (delete_on_exit)
        oss << " delete_on_exit";

    // tristate direct variable: OFF, TRY, ON
    if (direct == DIRECT_OFF)
    {
        oss << " direct=off";
    }
    else if (direct == DIRECT_TRY)
    { } // silenced: oss << " direct=try";
    else if (direct == DIRECT_ON)
    {
        oss << " direct=on";
    }
    else
        FOXXLL_THROW(std::runtime_error, "Invalid setting for 'direct' option.");

    if (flash) {
        oss << " flash";
    }

    if (queue != file::DEFAULT_QUEUE && queue != file::DEFAULT_LINUXAIO_QUEUE) {
        oss << " queue=" << queue;
    }

    if (device_id != file::DEFAULT_DEVICE_ID) {
        oss << " devid=" << device_id;
    }

    if (raw_device) {
        oss << " raw_device";
    }

    if (unlink_on_open) {
        oss << " unlink_on_open";
    }

    if (queue_length != 0) {
        oss << " queue_length=" << queue_length;
    }

    return oss.str();
}